

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::TextTemplateToken::TextTemplateToken
          (TextTemplateToken *this,Location *loc,SpaceHandling pre,SpaceHandling post,string *t)

{
  TemplateToken::TemplateToken(&this->super_TemplateToken,Text,loc,pre,post);
  (this->super_TemplateToken)._vptr_TemplateToken = (_func_int **)&PTR__TextTemplateToken_0022e438;
  std::__cxx11::string::string((string *)&this->text,(string *)t);
  return;
}

Assistant:

TextTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, const std::string& t) : TemplateToken(Type::Text, loc, pre, post), text(t) {}